

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int havingToWhereExprCb(Walker *pWalker,Expr *pExpr)

{
  undefined8 uVar1;
  Select *pSVar2;
  Expr *pLeft;
  char cVar3;
  u8 uVar4;
  undefined1 uVar5;
  u32 uVar6;
  int iVar7;
  Expr *pRight;
  Expr *pEVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  Expr *pEVar13;
  Expr *pEVar14;
  Expr *pEVar15;
  Expr *pEVar16;
  byte bVar17;
  Expr t;
  
  bVar17 = 0;
  pEVar8 = &t;
  iVar12 = 0;
  if (pExpr->op != ',') {
    pSVar2 = (pWalker->u).pSelect;
    iVar7 = sqlite3ExprIsConstantOrGroupBy(pWalker->pParse,pExpr,pSVar2->pGroupBy);
    iVar12 = 1;
    if ((((iVar7 != 0) && ((pExpr->flags & 0x20000001) != 0x20000000)) &&
        (pExpr->pAggInfo == (AggInfo *)0x0)) &&
       (pRight = sqlite3Expr(pWalker->pParse->db,0x9b,"1"), pRight != (Expr *)0x0)) {
      pLeft = pSVar2->pWhere;
      lVar11 = 9;
      pEVar13 = pRight;
      pEVar15 = &t;
      for (lVar9 = lVar11; lVar10 = lVar11, pEVar14 = pExpr, pEVar16 = pRight, lVar9 != 0;
          lVar9 = lVar9 + -1) {
        *(undefined8 *)pEVar15 = *(undefined8 *)pEVar13;
        pEVar13 = (Expr *)((long)pEVar13 + (ulong)bVar17 * -0x10 + 8);
        pEVar15 = (Expr *)((long)pEVar15 + ((ulong)bVar17 * -2 + 1) * 8);
      }
      for (; lVar10 != 0; lVar10 = lVar10 + -1) {
        cVar3 = pEVar14->affExpr;
        uVar4 = pEVar14->op2;
        uVar5 = pEVar14->field_0x3;
        uVar6 = pEVar14->flags;
        pEVar16->op = pEVar14->op;
        pEVar16->affExpr = cVar3;
        pEVar16->op2 = uVar4;
        pEVar16->field_0x3 = uVar5;
        pEVar16->flags = uVar6;
        pEVar14 = (Expr *)((long)pEVar14 + (ulong)bVar17 * -0x10 + 8);
        pEVar16 = (Expr *)((long)pEVar16 + (ulong)bVar17 * -0x10 + 8);
      }
      for (; lVar11 != 0; lVar11 = lVar11 + -1) {
        uVar1 = *(undefined8 *)pEVar8;
        pExpr->op = (char)uVar1;
        pExpr->affExpr = (char)((ulong)uVar1 >> 8);
        pExpr->op2 = (char)((ulong)uVar1 >> 0x10);
        pExpr->field_0x3 = (char)((ulong)uVar1 >> 0x18);
        pExpr->flags = (int)((ulong)uVar1 >> 0x20);
        pEVar8 = (Expr *)((long)pEVar8 + ((ulong)bVar17 * -2 + 1) * 8);
        pExpr = (Expr *)((long)pExpr + (ulong)bVar17 * -0x10 + 8);
      }
      pEVar8 = sqlite3ExprAnd(pWalker->pParse,pLeft,pRight);
      pSVar2->pWhere = pEVar8;
      pWalker->eCode = 1;
    }
  }
  return iVar12;
}

Assistant:

static int havingToWhereExprCb(Walker *pWalker, Expr *pExpr){
  if( pExpr->op!=TK_AND ){
    Select *pS = pWalker->u.pSelect;
    /* This routine is called before the HAVING clause of the current
    ** SELECT is analyzed for aggregates. So if pExpr->pAggInfo is set
    ** here, it indicates that the expression is a correlated reference to a
    ** column from an outer aggregate query, or an aggregate function that
    ** belongs to an outer query. Do not move the expression to the WHERE
    ** clause in this obscure case, as doing so may corrupt the outer Select
    ** statements AggInfo structure.  */
    if( sqlite3ExprIsConstantOrGroupBy(pWalker->pParse, pExpr, pS->pGroupBy)
     && ExprAlwaysFalse(pExpr)==0
     && pExpr->pAggInfo==0
    ){
      sqlite3 *db = pWalker->pParse->db;
      Expr *pNew = sqlite3Expr(db, TK_INTEGER, "1");
      if( pNew ){
        Expr *pWhere = pS->pWhere;
        SWAP(Expr, *pNew, *pExpr);
        pNew = sqlite3ExprAnd(pWalker->pParse, pWhere, pNew);
        pS->pWhere = pNew;
        pWalker->eCode = 1;
      }
    }
    return WRC_Prune;
  }
  return WRC_Continue;
}